

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArguments.cxx
# Opt level: O0

bool __thiscall
adios2sys::CommandLineArguments::PopulateVariable
          (CommandLineArguments *this,CommandLineArgumentsCallbackStructure *cs,char *value)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  CommandLineArguments *this_00;
  char *in_RDX;
  undefined8 *in_RSI;
  CommandLineArguments *in_RDI;
  string var;
  string *in_stack_ffffffffffffff78;
  CommandLineArguments *in_stack_ffffffffffffff80;
  vector<bool,_std::allocator<bool>_> *in_stack_ffffffffffffff88;
  allocator *variable;
  allocator local_41;
  string local_40 [32];
  char *local_20;
  undefined8 *local_18;
  byte local_1;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  if ((in_RSI[2] != 0) && (iVar2 = (*(code *)in_RSI[2])(*in_RSI,in_RDX,in_RSI[3]), iVar2 == 0)) {
    in_RDI->Internals->LastArgument = in_RDI->Internals->LastArgument - 1;
    local_1 = 0;
    goto LAB_00f41266;
  }
  if (local_18[4] != 0) {
    variable = &local_41;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,"1",variable);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    if (local_20 != (char *)0x0) {
      std::__cxx11::string::operator=(local_40,local_20);
    }
    this_00 = (CommandLineArguments *)(ulong)(*(int *)(local_18 + 5) - 1);
    switch(this_00) {
    case (CommandLineArguments *)0x0:
      PopulateVariable(this_00,(int *)in_stack_ffffffffffffff88,(string *)in_stack_ffffffffffffff80)
      ;
      break;
    case (CommandLineArguments *)0x1:
      PopulateVariable(in_stack_ffffffffffffff80,(bool *)in_stack_ffffffffffffff78,
                       (string *)0xf4111a);
      break;
    case (CommandLineArguments *)0x2:
      PopulateVariable(this_00,(double *)in_stack_ffffffffffffff88,
                       (string *)in_stack_ffffffffffffff80);
      break;
    case (CommandLineArguments *)0x3:
      PopulateVariable(this_00,(char **)in_stack_ffffffffffffff88,
                       (string *)in_stack_ffffffffffffff80);
      break;
    case (CommandLineArguments *)0x4:
      PopulateVariable(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,(string *)0xf410fb);
      break;
    case (CommandLineArguments *)0x5:
      PopulateVariable(in_RDI,(vector<int,_std::allocator<int>_> *)variable,(string *)this_00);
      break;
    case (CommandLineArguments *)0x6:
      PopulateVariable(this_00,in_stack_ffffffffffffff88,(string *)in_stack_ffffffffffffff80);
      break;
    case (CommandLineArguments *)0x7:
      PopulateVariable(in_RDI,(vector<double,_std::allocator<double>_> *)variable,(string *)this_00)
      ;
      break;
    case (CommandLineArguments *)0x8:
      PopulateVariable(this_00,(vector<char_*,_std::allocator<char_*>_> *)in_stack_ffffffffffffff88,
                       (string *)in_stack_ffffffffffffff80);
      break;
    case (CommandLineArguments *)0x9:
      PopulateVariable(in_stack_ffffffffffffff80,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)in_stack_ffffffffffffff78,(string *)0xf411b5);
      break;
    default:
      poVar3 = std::operator<<((ostream *)&std::cerr,"Got unknown variable type: \"");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(int *)(local_18 + 5));
      poVar3 = std::operator<<(poVar3,"\"");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      in_RDI->Internals->LastArgument = in_RDI->Internals->LastArgument - 1;
      local_1 = 0;
      bVar1 = true;
      goto LAB_00f41246;
    }
    bVar1 = false;
LAB_00f41246:
    std::__cxx11::string::~string(local_40);
    if (bVar1) goto LAB_00f41266;
  }
  local_1 = 1;
LAB_00f41266:
  return (bool)(local_1 & 1);
}

Assistant:

bool CommandLineArguments::PopulateVariable(
  CommandLineArgumentsCallbackStructure* cs, const char* value)
{
  // Call the callback
  if (cs->Callback) {
    if (!cs->Callback(cs->Argument, value, cs->CallData)) {
      this->Internals->LastArgument--;
      return false;
    }
  }
  CommandLineArguments_DEBUG("Set argument: " << cs->Argument << " to "
                                              << value);
  if (cs->Variable) {
    std::string var = "1";
    if (value) {
      var = value;
    }
    switch (cs->VariableType) {
      case CommandLineArguments::INT_TYPE:
        this->PopulateVariable(static_cast<int*>(cs->Variable), var);
        break;
      case CommandLineArguments::DOUBLE_TYPE:
        this->PopulateVariable(static_cast<double*>(cs->Variable), var);
        break;
      case CommandLineArguments::STRING_TYPE:
        this->PopulateVariable(static_cast<char**>(cs->Variable), var);
        break;
      case CommandLineArguments::STL_STRING_TYPE:
        this->PopulateVariable(static_cast<std::string*>(cs->Variable), var);
        break;
      case CommandLineArguments::BOOL_TYPE:
        this->PopulateVariable(static_cast<bool*>(cs->Variable), var);
        break;
      case CommandLineArguments::VECTOR_BOOL_TYPE:
        this->PopulateVariable(static_cast<std::vector<bool>*>(cs->Variable),
                               var);
        break;
      case CommandLineArguments::VECTOR_INT_TYPE:
        this->PopulateVariable(static_cast<std::vector<int>*>(cs->Variable),
                               var);
        break;
      case CommandLineArguments::VECTOR_DOUBLE_TYPE:
        this->PopulateVariable(static_cast<std::vector<double>*>(cs->Variable),
                               var);
        break;
      case CommandLineArguments::VECTOR_STRING_TYPE:
        this->PopulateVariable(static_cast<std::vector<char*>*>(cs->Variable),
                               var);
        break;
      case CommandLineArguments::VECTOR_STL_STRING_TYPE:
        this->PopulateVariable(
          static_cast<std::vector<std::string>*>(cs->Variable), var);
        break;
      default:
        std::cerr << "Got unknown variable type: \"" << cs->VariableType
                  << "\"" << std::endl;
        this->Internals->LastArgument--;
        return false;
    }
  }
  return true;
}